

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::CheckClash
          (Parser *this,
          vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *fields,
          StructDef *struct_def,char *suffix,BaseType basetype)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int iVar1;
  char *pcVar2;
  FieldDef *__rhs_00;
  ulong uVar3;
  undefined4 in_register_00000084;
  BaseType in_R9D;
  long *plVar4;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = (char *)strlen((char *)CONCAT44(in_register_00000084,basetype));
  plVar4 = (long *)(struct_def->super_Definition).name._M_dataplus._M_p;
  do {
    if (plVar4 == (long *)(struct_def->super_Definition).name._M_string_length) {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00111579:
      return SUB82(this,0);
    }
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar4;
    uVar3 = (long)__rhs->_M_string_length - (long)pcVar2;
    if (pcVar2 <= (char *)__rhs->_M_string_length && uVar3 != 0) {
      iVar1 = std::__cxx11::string::compare((ulong)__rhs,uVar3,pcVar2);
      if ((iVar1 == 0) && (*(int *)(*plVar4 + 200) != 1)) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)__rhs);
        __rhs_00 = SymbolTable<flatbuffers::FieldDef>::Lookup
                             ((SymbolTable<flatbuffers::FieldDef> *)(suffix + 200),&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        if ((__rhs_00 != (FieldDef *)0x0) && ((__rhs_00->value).type.base_type == in_R9D)) {
          std::operator+(&local_50,"Field ",__rhs);
          std::operator+(&local_70,&local_50," would clash with generated functions for field ");
          std::operator+(&local_90,&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __rhs_00);
          Error(this,(string *)fields);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_00111579;
        }
      }
    }
    plVar4 = plVar4 + 1;
  } while( true );
}

Assistant:

CheckedError Parser::CheckClash(std::vector<FieldDef *> &fields,
                                StructDef *struct_def, const char *suffix,
                                BaseType basetype) {
  auto len = strlen(suffix);
  for (auto it = fields.begin(); it != fields.end(); ++it) {
    auto &fname = (*it)->name;
    if (fname.length() > len &&
        fname.compare(fname.length() - len, len, suffix) == 0 &&
        (*it)->value.type.base_type != BASE_TYPE_UTYPE) {
      auto field =
          struct_def->fields.Lookup(fname.substr(0, fname.length() - len));
      if (field && field->value.type.base_type == basetype)
        return Error("Field " + fname +
                     " would clash with generated functions for field " +
                     field->name);
    }
  }
  return NoError();
}